

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::SubdivMeshNode::calculateStatistics(SubdivMeshNode *this,Statistics *stat)

{
  MaterialNode *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  long in_RSI;
  SubdivMeshNode *in_RDI;
  SubdivMeshNode *this_00;
  
  (in_RDI->super_Node).indegree = (in_RDI->super_Node).indegree + 1;
  if ((in_RDI->super_Node).indegree == 1) {
    *(long *)(in_RSI + 0x30) = *(long *)(in_RSI + 0x30) + 1;
    this_00 = in_RDI;
    iVar2 = (*(in_RDI->super_Node).super_RefCount._vptr_RefCount[0xe])();
    *(long *)(in_RSI + 0x38) = CONCAT44(extraout_var,iVar2) + *(long *)(in_RSI + 0x38);
    sVar3 = numBytes(this_00);
    *(size_t *)(in_RSI + 0x40) = sVar3 + *(long *)(in_RSI + 0x40);
    pMVar1 = (in_RDI->material).ptr;
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[9])(pMVar1,in_RSI);
  }
  return;
}

Assistant:

void SceneGraph::SubdivMeshNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1) {
      stat.numSubdivMeshes++;
      stat.numPatches += numPrimitives();
      stat.numSubdivBytes += numBytes();
      material->calculateStatistics(stat);
    }
  }